

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

BIO_METHOD * ossl_bio_cf_method_create(void)

{
  BIO_METHOD *pBVar1;
  
  pBVar1 = (BIO_METHOD *)BIO_meth_new(0x401,"OpenSSL CF BIO");
  if (pBVar1 != (BIO_METHOD *)0x0) {
    BIO_meth_set_write(pBVar1,ossl_bio_cf_out_write);
    BIO_meth_set_read(pBVar1,ossl_bio_cf_in_read);
    BIO_meth_set_ctrl(pBVar1,ossl_bio_cf_ctrl);
    BIO_meth_set_create(pBVar1,ossl_bio_cf_create);
    BIO_meth_set_destroy(pBVar1,ossl_bio_cf_destroy);
  }
  return pBVar1;
}

Assistant:

static BIO_METHOD *ossl_bio_cf_method_create(void)
{
  BIO_METHOD *m = BIO_meth_new(BIO_TYPE_MEM, "OpenSSL CF BIO");
  if(m) {
    BIO_meth_set_write(m, &ossl_bio_cf_out_write);
    BIO_meth_set_read(m, &ossl_bio_cf_in_read);
    BIO_meth_set_ctrl(m, &ossl_bio_cf_ctrl);
    BIO_meth_set_create(m, &ossl_bio_cf_create);
    BIO_meth_set_destroy(m, &ossl_bio_cf_destroy);
  }
  return m;
}